

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

iterator * __thiscall
tcb::unicode::detail::
unicode_view<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_char32_t,_char>
::iterator::operator++(iterator *this)

{
  code_point cVar1;
  code_point *pcVar2;
  byte bVar3;
  encoded_chars<char> eVar4;
  code_point value;
  
  bVar3 = this->idx_ + 1;
  this->idx_ = bVar3;
  if (((this->next_chars_).size_ == (uint)bVar3) &&
     (pcVar2 = (this->first_)._M_current, pcVar2 != (this->last_)._M_current)) {
    (this->first_)._M_current = pcVar2 + 1;
    cVar1 = *pcVar2;
    value = L'\xffffffff';
    if ((cVar1 & 0x1ff800U) != 0xd800) {
      value = cVar1;
    }
    if (0x10ffff < (uint)cVar1) {
      value = L'\xffffffff';
    }
    eVar4 = utf_traits<char,_1>::encode(value);
    this->next_chars_ = eVar4;
    this->idx_ = '\0';
  }
  return this;
}

Assistant:

TCB_CONSTEXPR14 iterator& operator++()
        {
            if (++idx_ == next_chars_.size() && first_ != last_) {
                char32_t c = utf_traits<InCharT>::decode(first_, last_);
                next_chars_ = utf_traits<OutCharT>::encode(c);
                idx_ = 0;
            }
            return *this;
        }